

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

bool __thiscall banksia::ChessBoard::fromSanMoveList(ChessBoard *this,string *str)

{
  bool bVar1;
  int iVar2;
  ChessBoard *this_00;
  reference pbVar3;
  ulong uVar4;
  char *pcVar5;
  string *in_RSI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  Move MVar6;
  Move move;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  string ss;
  char in_stack_00000117;
  string *in_stack_00000118;
  string *in_stack_000001a8;
  ChessBoard *in_stack_000001b0;
  undefined4 in_stack_ffffffffffffff18;
  PieceType in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff28;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  undefined1 *local_80;
  undefined1 local_78 [36];
  PieceType in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb4;
  int from;
  string local_38 [55];
  byte local_1;
  
  std::__cxx11::string::string(local_38,in_RSI);
  std::__cxx11::string::begin();
  this_00 = (ChessBoard *)std::__cxx11::string::end();
  from = CONCAT13(0x2e,CONCAT12(0x20,in_stack_ffffffffffffffb4));
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (in_RDI,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  splitString(in_stack_00000118,in_stack_00000117);
  local_80 = local_78;
  local_88._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  MVar6.promotion = in_stack_ffffffffffffff1c;
  MVar6._0_8_ = in_stack_ffffffffffffff20;
  do {
    bVar1 = __gnu_cxx::operator!=
                      (MVar6._0_8_,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(MVar6.promotion,in_stack_ffffffffffffff18));
    if (!bVar1) {
      local_1 = 1;
LAB_001edf40:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_RDI._M_current);
      std::__cxx11::string::~string(local_38);
      return (bool)(local_1 & 1);
    }
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_88);
    uVar4 = std::__cxx11::string::length();
    if (1 < uVar4) {
      pcVar5 = (char *)std::__cxx11::string::at((ulong)pbVar3);
      iVar2 = isdigit((int)*pcVar5);
      if (iVar2 == 0) {
        MVar6 = fromSanString(in_stack_000001b0,in_stack_000001a8);
        bVar1 = checkMake(this_00,from,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
        in_stack_ffffffffffffff18 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff18);
        if (!bVar1) {
          local_1 = 0;
          goto LAB_001edf40;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_88);
  } while( true );
}

Assistant:

bool ChessBoard::fromSanMoveList(const std::string& str)
{
    // Some opening such as Gaviota one has no space between counter and move, e.g.
    // 1.d4 d5 2.c4 dxc4 3.Nf3 a6 4.e3 Nf6 5.Bxc4 b5 6.Bd3 Bb7 7.O-O Nbd7 8.b4 *
    auto ss = str;
    std::replace(ss.begin(), ss.end(), '.', ' ');
    auto vec = splitString(ss, ' ');
    
    for(auto && s : vec) {
        if (s.length() < 2 || isdigit(s.at(0))) {
            continue;
        }
        
        auto move = fromSanString(s);
        if (!checkMake(move.from, move.dest, move.promotion)) {
            return false;
        }
    }
    return true;
}